

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O2

char * bufread_simple_label(shared_data *sd,label_data *ld,char *c)

{
  float l;
  
  l = *(float *)c;
  ld->label = l;
  ld->weight = *(float *)(c + 4);
  ld->initial = *(float *)(c + 8);
  count_label(sd,l);
  return c + 0xc;
}

Assistant:

char* bufread_simple_label(shared_data* sd, label_data* ld, char* c)
{
  memcpy(&ld->label, c, sizeof(ld->label));
  //  cout << ld->label << " " << sd->is_more_than_two_labels_observed << " " << sd->first_observed_label <<  endl;
  c += sizeof(ld->label);
  memcpy(&ld->weight, c, sizeof(ld->weight));
  c += sizeof(ld->weight);
  memcpy(&ld->initial, c, sizeof(ld->initial));
  c += sizeof(ld->initial);

  count_label(sd, ld->label);
  return c;
}